

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

int __thiscall ncnn::Layer_final::create_pipeline(Layer_final *this,Option *opt)

{
  int iVar1;
  undefined8 in_RSI;
  Layer_final *in_RDI;
  int ret;
  
  set_layer_properties(in_RDI);
  iVar1 = (*in_RDI->layer_cpu->_vptr_Layer[4])(in_RDI->layer_cpu,in_RSI);
  get_layer_properties(in_RDI);
  return iVar1;
}

Assistant:

virtual int create_pipeline(const Option& opt)
    {
        set_layer_properties();
#if NCNN_VULKAN
        if (layer_vulkan)
        {
            if (vkdev)
            {
                int ret = layer_vulkan->create_pipeline(opt);
                get_layer_properties();
                return ret;
            }

            // fallback to cpu layer
            delete layer_vulkan;
            layer_vulkan = 0;
        }
#endif // NCNN_VULKAN

        int ret = layer_cpu->create_pipeline(opt);
        get_layer_properties();
        return ret;
    }